

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

int firstNamelessRecord(int m,int firstcode)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  int i;
  uint uVar5;
  
  iVar2 = m;
  if (firstcode <= m) {
    piVar4 = &TERRITORY_BOUNDARIES[m].flags;
    uVar1 = *piVar4;
    lVar3 = (long)m + 1;
    do {
      iVar2 = m;
      if (((*piVar4 & 0x40U) == 0) ||
         (uVar5 = *piVar4 & 0x1f,
         uVar5 + (uVar5 / 5) * 5 + 1 != (uVar1 & 0x1f) + ((uVar1 & 0x1f) / 5) * 5 + 1)) break;
      m = m + -1;
      lVar3 = lVar3 + -1;
      piVar4 = piVar4 + -5;
      iVar2 = firstcode + -1;
    } while (firstcode < lVar3);
  }
  return iVar2 + 1;
}

Assistant:

static int firstNamelessRecord(const int m, const int firstcode) {
    int i = m;
    const int codexm = coDex(m);
    ASSERT((0 <= m) && (m <= MAPCODE_BOUNDARY_MAX));
    ASSERT((0 <= firstcode) && (firstcode <= MAPCODE_BOUNDARY_MAX));
    while (i >= firstcode && coDex(i) == codexm && IS_NAMELESS(i)) {
        i--;
    }
    return (i + 1);
}